

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestTest.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_2ec4d::TestPassingTestHasNoFailures::~TestPassingTestHasNoFailures
          (TestPassingTestHasNoFailures *this)

{
  UnitTest::Test::~Test(&this->super_Test);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST(PassingTestHasNoFailures)
{
    class PassingTest : public Test
    {
    public:
        PassingTest() : Test("passing") {}
        virtual void RunImpl() const
        {
            CHECK(true);
        }
    };

    TestResults results;
	{
		ScopedCurrentTest scopedResults(results);
		PassingTest().Run();
	}

    CHECK_EQUAL(0, results.GetFailureCount());
}